

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O2

void producerThread(void *arg)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  deRandom random;
  
  deRandom_init(&random,0x7b);
  iVar3 = 0;
  iVar2 = 0;
  do {
    uVar4 = 0;
    if (iVar3 != 10000) {
      if (iVar3 == 0x2711) {
        return;
      }
      dVar1 = deRandom_getUint32(&random);
      uVar4 = dVar1 + (dVar1 == 0);
    }
    deSemaphore_decrement(*(deSemaphore *)((long)arg + 0x80));
    *(uint *)((long)arg + (long)iVar2 * 4) = uVar4;
    iVar2 = (iVar2 + 1) % 0x20;
    deSemaphore_increment(*(deSemaphore *)((long)arg + 0x88));
    *(uint *)((long)arg + 0x90) = *(uint *)((long)arg + 0x90) ^ uVar4;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void producerThread (void* arg)
{
	TestBuffer* buffer = (TestBuffer*)arg;
	deRandom	random;
	int			ndx;
	int			numToProduce	= 10000;
	int			writePos		= 0;

	deRandom_init(&random, 123);

	for (ndx = 0; ndx <= numToProduce; ndx++)
	{
		deUint32 val;

		if (ndx == numToProduce)
		{
			val = 0u; /* End. */
		}
		else
		{
			val = deRandom_getUint32(&random);
			val = val ? val : 1u;
		}

		deSemaphore_decrement(buffer->empty);

		buffer->buffer[writePos] = val;
		writePos = (writePos + 1) % DE_LENGTH_OF_ARRAY(buffer->buffer);

		deSemaphore_increment(buffer->fill);

		buffer->producerHash ^= val;
	}
}